

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void check_forwarding(mock_allocator<int> *alloc,allocator_ref<mock_allocator<int>_> *ref)

{
  MockSpec<int_*(unsigned_long)> *value;
  MockSpec<void_(int_*,_unsigned_long)> *this;
  Matcher<int_*> *in_RDI;
  char *in_stack_00000020;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  MockSpec<void_(int_*,_unsigned_long)> *in_stack_00000040;
  value_type *ptr;
  int mem;
  Matcher<unsigned_long> *in_stack_ffffffffffffff28;
  mock_allocator<int> *in_stack_ffffffffffffff30;
  mock_allocator<int> *this_00;
  Matcher<int_*> *this_01;
  unsigned_long in_stack_ffffffffffffff68;
  Matcher<int_*> *in_stack_ffffffffffffff70;
  Action<int_*(unsigned_long)> *in_stack_ffffffffffffffa8;
  TypedExpectation<int_*(unsigned_long)> *in_stack_ffffffffffffffb0;
  
  this_01 = in_RDI;
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  value = mock_allocator<int>::gmock_allocate(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  testing::internal::MockSpec<int_*(unsigned_long)>::InternalExpectedAt
            ((MockSpec<int_*(unsigned_long)> *)in_stack_00000040,in_stack_00000038,in_stack_00000034
             ,in_stack_00000028,in_stack_00000020);
  testing::Return<int*>((int *)in_stack_ffffffffffffff28);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction<int_*> *)this_01);
  testing::internal::TypedExpectation<int_*(unsigned_long)>::WillOnce
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  testing::Action<int_*(unsigned_long)>::~Action((Action<int_*(unsigned_long)> *)0x123bff);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x123c0c);
  this_00 = (mock_allocator<int> *)0x2a;
  allocator_ref<mock_allocator<int>_>::allocate
            ((allocator_ref<mock_allocator<int>_> *)in_stack_ffffffffffffff30,
             (size_t)in_stack_ffffffffffffff28);
  testing::Matcher<int_*>::Matcher(in_stack_ffffffffffffff70,(int *)value);
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)in_stack_ffffffffffffff70,(unsigned_long)value);
  this = mock_allocator<int>::gmock_deallocate
                   (this_00,in_RDI,(Matcher<unsigned_long> *)in_stack_ffffffffffffff30);
  testing::internal::MockSpec<void_(int_*,_unsigned_long)>::InternalExpectedAt
            (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000028,
             in_stack_00000020);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x123c9e);
  testing::Matcher<int_*>::~Matcher((Matcher<int_*> *)0x123ca8);
  allocator_ref<mock_allocator<int>_>::deallocate
            ((allocator_ref<mock_allocator<int>_> *)this,(value_type *)in_stack_ffffffffffffff28,
             0x123cc2);
  return;
}

Assistant:

static void check_forwarding(
    mock_allocator<int> &alloc, allocator_ref<mock_allocator<int>> &ref) {
  int mem;
  // Check if value_type is properly defined.
  allocator_ref< mock_allocator<int> >::value_type *ptr = &mem;
  // Check forwarding.
  EXPECT_CALL(alloc, allocate(42)).WillOnce(testing::Return(ptr));
  ref.allocate(42);
  EXPECT_CALL(alloc, deallocate(ptr, 42));
  ref.deallocate(ptr, 42);
}